

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

Token __thiscall
trieste::wf::Gen::choose
          (Gen *this,vector<trieste::Token,_std::allocator<trieste::Token>_> *tokens,size_t depth)

{
  anon_class_16_2_f7aa0bb0 __unary_op;
  size_t this_00;
  result_type rVar1;
  result_type rVar2;
  result_type rVar3;
  result_type rVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> __result;
  iterator iVar7;
  iterator iVar8;
  iterator __result_00;
  reference pvVar9;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> it;
  double value;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> offsets;
  size_t choice;
  size_t depth_local;
  vector<trieste::Token,_std::allocator<trieste::Token>_> *tokens_local;
  Gen *this_local;
  
  choice = depth;
  depth_local = (size_t)tokens;
  tokens_local = (vector<trieste::Token,_std::allocator<trieste::Token>_> *)this;
  sVar5 = std::vector<trieste::Token,_std::allocator<trieste::Token>_>::size
                    ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)tokens);
  if (sVar5 == 1) {
    pvVar6 = CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::operator[]
                       ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)depth_local,0);
    this_local = (Gen *)pvVar6->def;
  }
  else if (this->target_depth < choice) {
    CLI::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_48);
    __first = std::vector<trieste::Token,_std::allocator<trieste::Token>_>::begin
                        ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)depth_local);
    __last = std::vector<trieste::Token,_std::allocator<trieste::Token>_>::end
                       ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)depth_local);
    __result = std::back_inserter<std::vector<double,std::allocator<double>>>
                         ((vector<double,_std::allocator<double>_> *)local_48);
    __unary_op.depth = &choice;
    __unary_op.this = this;
    std::
    transform<__gnu_cxx::__normal_iterator<trieste::Token_const*,std::vector<trieste::Token,std::allocator<trieste::Token>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,trieste::wf::Gen::choose(std::vector<trieste::Token,std::allocator<trieste::Token>>const&,unsigned_long)::_lambda(trieste::Token_const&)_1_>
              ((__normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
                )__first._M_current,
               (__normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
                )__last._M_current,__result,__unary_op);
    iVar7 = CLI::std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_48);
    iVar8 = CLI::std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)local_48);
    __result_00 = CLI::std::vector<double,_std::allocator<double>_>::begin
                            ((vector<double,_std::allocator<double>_> *)local_48);
    std::
    partial_sum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar7._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar8._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __result_00._M_current);
    rVar1 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::operator()
                      (&this->rand);
    rVar2 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::min();
    rVar3 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::max();
    rVar4 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::min();
    pvVar9 = CLI::std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)local_48);
    it._M_current = (double *)(((double)(rVar1 - rVar2) / (double)(rVar3 - rVar4)) * *pvVar9);
    iVar7 = CLI::std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_48);
    iVar8 = CLI::std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)local_48);
    __last_00 = std::
                lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                          (iVar7._M_current,iVar8._M_current,(double *)&it);
    this_00 = depth_local;
    iVar7 = CLI::std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_48);
    sVar5 = std::
            distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       iVar7._M_current,__last_00);
    pvVar6 = CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::operator[]
                       ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)this_00,sVar5);
    this_local = (Gen *)pvVar6->def;
    CLI::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_48);
  }
  else {
    rVar1 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::operator()
                      (&this->rand);
    sVar5 = std::vector<trieste::Token,_std::allocator<trieste::Token>_>::size
                      ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)depth_local);
    offsets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)((ulong)rVar1 % sVar5);
    pvVar6 = CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::operator[]
                       ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)depth_local,
                        (size_type)
                        offsets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    this_local = (Gen *)pvVar6->def;
  }
  return (Token)(TokenDef *)this_local;
}

Assistant:

Token choose(const std::vector<Token>& tokens, std::size_t depth)
      {
        if (tokens.size() == 1)
        {
          return tokens[0];
        }

        if (depth <= target_depth)
        {
          std::size_t choice = rand() % tokens.size();
          return tokens[choice];
        }

        // compute 1 / (1 + alpha * (depth - target_depth) * distance)
        std::vector<double> offsets;
        std::transform(
          tokens.begin(),
          tokens.end(),
          std::back_inserter(offsets),
          [&](const Token& t) {
            if (
              token_terminal_distance.find(t) != token_terminal_distance.end())
            {
              std::size_t distance = token_terminal_distance.at(t);
              return 1.0 / (1.0 + (alpha * (depth - target_depth) * distance));
            }
            else
            {
              std::ostringstream err;
              err << "Token " << t.str()
                  << " not found in token_terminal_distance map" << std::endl;
              err << "{";
              std::string delim = "";
              for (auto const& [key, val] : token_terminal_distance)
              {
                err << delim << key.str() << ":" << val;
                delim = ", ";
              }
              err << "}" << std::endl;
              throw std::runtime_error(err.str());
            }
          });

        // compute the cumulative distribution of P(d | c, p)
        std::partial_sum(offsets.begin(), offsets.end(), offsets.begin());

        // instead of normalizing the cumulative distribution, scale the random
        // number to the sum of the probabilities
        double value = static_cast<double>(rand() - rand.min()) /
          static_cast<double>(rand.max() - rand.min()) * offsets.back();

        // finding the first element greater than the uniform random number is
        // the same as performing a weighted sampling of the P(c | d, p)
        // distribution
        auto it = std::lower_bound(offsets.begin(), offsets.end(), value);

        return tokens[std::distance(offsets.begin(), it)];
      }